

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

PLYElement * __thiscall gvr::PLYReader::findElement(PLYReader *this,string *name)

{
  int iVar1;
  size_type sVar2;
  const_reference ppPVar3;
  string *psVar4;
  long in_RDI;
  size_t i;
  PLYElement *ret;
  ulong local_20;
  value_type local_18;
  
  local_18 = (value_type)0x0;
  for (local_20 = 0;
      sVar2 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 0x228)), local_20 < sVar2 && local_18 == (value_type)0x0;
      local_20 = local_20 + 1) {
    ppPVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 0x228),local_20);
    psVar4 = PLYElement::getName_abi_cxx11_(*ppPVar3);
    iVar1 = std::__cxx11::string::compare((string *)psVar4);
    if (iVar1 == 0) {
      ppPVar3 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 0x228),local_20);
      local_18 = *ppPVar3;
    }
  }
  return local_18;
}

Assistant:

PLYElement *PLYReader::findElement(const std::string &name) const
{
  PLYElement *ret=0;

  for (size_t i=0; i<list.size() && ret == 0; i++)
  {
    if (list[i]->getName().compare(name) == 0)
    {
      ret=list[i];
    }
  }

  return ret;
}